

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O0

bool __thiscall SplineSolver<5U,_1U>::build_solver(SplineSolver<5U,_1U> *this,int N,int M)

{
  ComputationInfo CVar1;
  Scalar *pSVar2;
  ostream *this_00;
  int in_ESI;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *in_RDI;
  int k;
  Index in_stack_00000048;
  Index in_stack_00000050;
  SparseMatrix<double,_0,_int> *in_stack_00000058;
  SparseMatrix<double,_0,_int> *in_stack_ffffffffffffff58;
  MatrixType *matrix;
  SparseMatrix<double,_0,_int> *reserveSizes;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar3;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  SparseMatrix<double,_0,_int> *in_stack_ffffffffffffff80;
  SparseMatrix<double,_0,_int> *in_stack_ffffffffffffff90;
  SparseMatrix<double,_0,_int> local_60;
  int local_14;
  
  reserveSizes = &local_60;
  local_14 = in_ESI;
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
            (in_stack_ffffffffffffff80,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
             ,CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  Eigen::SparseMatrix<double,_0,_int>::operator=
            ((SparseMatrix<double,_0,_int> *)in_RDI,in_stack_ffffffffffffff58);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix(&local_60);
  matrix = (MatrixType *)&in_RDI->m_factorizationIsOk;
  Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::Constant
            (CONCAT44(6,in_stack_ffffffffffffff78),
             (Scalar *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  Eigen::SparseMatrix<double,0,int>::
  reserve<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>>
            ((SparseMatrix<double,_0,_int> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
              *)reserveSizes,(value_type *)in_RDI);
  for (iVar3 = 0; iVar3 < local_14 + -2; iVar3 = iVar3 + 1) {
    pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                       (in_stack_00000058,in_stack_00000050,in_stack_00000048);
    *pSVar2 = 16.0;
    pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                       (in_stack_00000058,in_stack_00000050,in_stack_00000048);
    *pSVar2 = 0.0;
    pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                       (in_stack_00000058,in_stack_00000050,in_stack_00000048);
    *pSVar2 = 0.0;
    pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                       (in_stack_00000058,in_stack_00000050,in_stack_00000048);
    *pSVar2 = -6.0;
    if (0 < iVar3) {
      pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                         (in_stack_00000058,in_stack_00000050,in_stack_00000048);
      *pSVar2 = 7.0;
      pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                         (in_stack_00000058,in_stack_00000050,in_stack_00000048);
      *pSVar2 = 8.0;
      pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                         (in_stack_00000058,in_stack_00000050,in_stack_00000048);
      *pSVar2 = 1.0;
      pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                         (in_stack_00000058,in_stack_00000050,in_stack_00000048);
      *pSVar2 = 1.0;
    }
    if (iVar3 < local_14 + -3) {
      pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                         (in_stack_00000058,in_stack_00000050,in_stack_00000048);
      *pSVar2 = 7.0;
      pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                         (in_stack_00000058,in_stack_00000050,in_stack_00000048);
      *pSVar2 = -8.0;
      pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                         (in_stack_00000058,in_stack_00000050,in_stack_00000048);
      *pSVar2 = -1.0;
      pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                         (in_stack_00000058,in_stack_00000050,in_stack_00000048);
      *pSVar2 = 1.0;
    }
  }
  Eigen::SparseMatrix<double,_0,_int>::makeCompressed(in_stack_ffffffffffffff90);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::compute
            (in_RDI,matrix);
  CVar1 = Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::info
                    (in_RDI);
  if (CVar1 != Success) {
    this_00 = std::operator<<((ostream *)&std::cout,"inverse failed");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return CVar1 == Success;
}

Assistant:

bool SplineSolver<5, Dims>::build_solver(const int N, const int M)
{
    A = SparseMatrix<double>(M, M);
    A.reserve(VectorXi::Constant(M, 6));

    for (int k = 0; k<N-2; ++k)
    {
        A.insert(k, k) = 16;
        A.insert(N-2+k, k) = 0;
        A.insert(k, N-2+k) = 0;
        A.insert(N-2+k, N-2+k) = -6;

        if (k > 0)
        {
            A.insert(k, k-1) = 7;
            A.insert(N-2+k, k-1) = 8;
            A.insert(k, N-2+k-1) = 1;
            A.insert(N-2+k, N-2+k-1) = 1;
        }

        if (k < N-3)
        {
            A.insert(k, k+1) = 7;
            A.insert(N-2+k, k+1) = -8;
            A.insert(k, N-2+k+1) = -1;
            A.insert(N-2+k, N-2+k+1) = 1;
        }
    }

    A.makeCompressed();
    solver.compute(A);

    if (solver.info() != Success)
    {
        cout << "inverse failed" << endl;
        return false;
    }

    return true;
}